

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O2

string * val_to_rnum_abi_cxx11_(uint32_t i)

{
  const_iterator cVar1;
  uint in_ESI;
  string *in_RDI;
  uint local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_5c = in_ESI;
  cVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&numerals_abi_cxx11_._M_t,&local_5c);
  if ((_Rb_tree_header *)cVar1._M_node == &numerals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::to_string(&local_38,local_5c);
    std::operator+(&local_58,&local_38," is out of [1, 3999]");
    error(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)&cVar1._M_node[1]._M_parent);
  return in_RDI;
}

Assistant:

std::string val_to_rnum(uint32_t i)
{
	auto found = numerals.find(i);
	if (found == numerals.end())
	{
		error(std::to_string(i) + " is out of [1, 3999]");
	}
	return found->second;
}